

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.h
# Opt level: O3

void __thiscall
btGeneric6DofSpring2Constraint::setAngularLowerLimit
          (btGeneric6DofSpring2Constraint *this,btVector3 *angularLower)

{
  btRotationalLimitMotor2 *pbVar1;
  int i;
  long lVar2;
  btScalar bVar3;
  
  pbVar1 = this->m_angularLimits;
  lVar2 = 0;
  do {
    bVar3 = fmodf(angularLower->m_floats[lVar2],6.2831855);
    if (-3.1415927 <= bVar3) {
      if (3.1415927 < bVar3) {
        bVar3 = bVar3 + -6.2831855;
      }
    }
    else {
      bVar3 = bVar3 + 6.2831855;
    }
    pbVar1->m_loLimit = bVar3;
    lVar2 = lVar2 + 1;
    pbVar1 = pbVar1 + 1;
  } while (lVar2 != 3);
  return;
}

Assistant:

void setAngularLowerLimit(const btVector3& angularLower)
	{
		for(int i = 0; i < 3; i++) 
			m_angularLimits[i].m_loLimit = btNormalizeAngle(angularLower[i]);
	}